

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_> * __thiscall
kj::_::ExceptionOr<kj::Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>::operator=
          (ExceptionOr<kj::Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_> *this,
          ExceptionOr<kj::Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_> *param_1)

{
  PromiseNode *pPVar1;
  
  NullableValue<kj::Exception>::operator=
            ((NullableValue<kj::Exception> *)this,(NullableValue<kj::Exception> *)param_1);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&(this->value).ptr.field_1.value);
    }
    if ((param_1->value).ptr.isSet == true) {
      pPVar1 = (param_1->value).ptr.field_1.value.super_PromiseBase.node.ptr;
      (this->value).ptr.field_1.value.super_PromiseBase.node.disposer =
           (param_1->value).ptr.field_1.value.super_PromiseBase.node.disposer;
      (this->value).ptr.field_1.value.super_PromiseBase.node.ptr = pPVar1;
      (param_1->value).ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (this->value).ptr.isSet = true;
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;